

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

ze_image_format_layout_t to_layout(string *layout)

{
  bool bVar1;
  ze_image_format_layout_t zVar2;
  ostream *poVar3;
  
  bVar1 = std::operator==(layout,"8");
  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8;
  if (!bVar1) {
    bVar1 = std::operator==(layout,"16");
    if (bVar1) {
      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16;
    }
    else {
      bVar1 = std::operator==(layout,"32");
      if (bVar1) {
        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32;
      }
      else {
        bVar1 = std::operator==(layout,"8_8");
        if (bVar1) {
          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8_8;
        }
        else {
          bVar1 = std::operator==(layout,"8_8_8_8");
          if (bVar1) {
            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8;
          }
          else {
            bVar1 = std::operator==(layout,"16_16");
            if (bVar1) {
              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16_16;
            }
            else {
              bVar1 = std::operator==(layout,"16_16_16_16");
              if (bVar1) {
                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16;
              }
              else {
                bVar1 = std::operator==(layout,"32_32");
                if (bVar1) {
                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32_32;
                }
                else {
                  bVar1 = std::operator==(layout,"32_32_32_32");
                  if (bVar1) {
                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32;
                  }
                  else {
                    bVar1 = std::operator==(layout,"10_10_10_2");
                    if (bVar1) {
                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2;
                    }
                    else {
                      bVar1 = std::operator==(layout,"11_11_10");
                      if (bVar1) {
                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_11_11_10;
                      }
                      else {
                        bVar1 = std::operator==(layout,"5_6_5");
                        if (bVar1) {
                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_5_6_5;
                        }
                        else {
                          bVar1 = std::operator==(layout,"5_5_5_1");
                          if (bVar1) {
                            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1;
                          }
                          else {
                            bVar1 = std::operator==(layout,"4_4_4_4");
                            if (bVar1) {
                              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4;
                            }
                            else {
                              bVar1 = std::operator==(layout,"Y8");
                              if (bVar1) {
                                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y8;
                              }
                              else {
                                bVar1 = std::operator==(layout,"NV12");
                                if (bVar1) {
                                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_NV12;
                                }
                                else {
                                  bVar1 = std::operator==(layout,"YUYV");
                                  if (bVar1) {
                                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_YUYV;
                                  }
                                  else {
                                    bVar1 = std::operator==(layout,"VYUY");
                                    if (bVar1) {
                                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_VYUY;
                                    }
                                    else {
                                      bVar1 = std::operator==(layout,"YVYU");
                                      if (bVar1) {
                                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_YVYU;
                                      }
                                      else {
                                        bVar1 = std::operator==(layout,"UYVY");
                                        if (bVar1) {
                                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_UYVY;
                                        }
                                        else {
                                          bVar1 = std::operator==(layout,"AYUV");
                                          if (bVar1) {
                                            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_AYUV;
                                          }
                                          else {
                                            bVar1 = std::operator==(layout,"P010");
                                            if (bVar1) {
                                              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P010;
                                            }
                                            else {
                                              bVar1 = std::operator==(layout,"Y410");
                                              if (bVar1) {
                                                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y410;
                                              }
                                              else {
                                                bVar1 = std::operator==(layout,"P012");
                                                if (bVar1) {
                                                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P012;
                                                }
                                                else {
                                                  bVar1 = std::operator==(layout,"Y16");
                                                  if (bVar1) {
                                                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y16;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(layout,"P016");
                                                    if (bVar1) {
                                                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P016;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(layout,"Y216");
                                                      if (bVar1) {
                                                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y216;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(layout,"P216");
                                                        if (bVar1) {
                                                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P216;
                                                        }
                                                        else {
                                                          poVar3 = std::operator<<((ostream *)
                                                                                   &std::cout,
                                                                                                                                                                      
                                                  "Unknown ze_image_format_layout_t value: ");
                                                  std::operator<<(poVar3,(string *)layout);
                                                  zVar2 = ~ZE_IMAGE_FORMAT_LAYOUT_8;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_format_layout_t to_layout(const std::string layout) {
  if (layout == "8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8;
  } else if (layout == "16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16;
  } else if (layout == "32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32;
  } else if (layout == "8_8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8_8;
  } else if (layout == "8_8_8_8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8;
  } else if (layout == "16_16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16_16;
  } else if (layout == "16_16_16_16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16;
  } else if (layout == "32_32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32_32;
  } else if (layout == "32_32_32_32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32;
  } else if (layout == "10_10_10_2") {
    return ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2;
  } else if (layout == "11_11_10") {
    return ZE_IMAGE_FORMAT_LAYOUT_11_11_10;
  } else if (layout == "5_6_5") {
    return ZE_IMAGE_FORMAT_LAYOUT_5_6_5;
  } else if (layout == "5_5_5_1") {
    return ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1;
  } else if (layout == "4_4_4_4") {
    return ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4;
  } else if (layout == "Y8") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y8;
  } else if (layout == "NV12") {
    return ZE_IMAGE_FORMAT_LAYOUT_NV12;
  } else if (layout == "YUYV") {
    return ZE_IMAGE_FORMAT_LAYOUT_YUYV;
  } else if (layout == "VYUY") {
    return ZE_IMAGE_FORMAT_LAYOUT_VYUY;
  } else if (layout == "YVYU") {
    return ZE_IMAGE_FORMAT_LAYOUT_YVYU;
  } else if (layout == "UYVY") {
    return ZE_IMAGE_FORMAT_LAYOUT_UYVY;
  } else if (layout == "AYUV") {
    return ZE_IMAGE_FORMAT_LAYOUT_AYUV;
  } else if (layout == "P010") {
    return ZE_IMAGE_FORMAT_LAYOUT_P010;
  } else if (layout == "Y410") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y410;
  } else if (layout == "P012") {
    return ZE_IMAGE_FORMAT_LAYOUT_P012;
  } else if (layout == "Y16") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y16;
  } else if (layout == "P016") {
    return ZE_IMAGE_FORMAT_LAYOUT_P016;
  } else if (layout == "Y216") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y216;
  } else if (layout == "P216") {
    return ZE_IMAGE_FORMAT_LAYOUT_P216;
  } else {
    std::cout << "Unknown ze_image_format_layout_t value: " << layout;
    return static_cast<ze_image_format_layout_t>(-1);
  }
}